

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFactored
          (FBXConverter *this,PropertyTable *props,string *colorName,string *factorName,bool *result
          ,bool useTemplate)

{
  ulong uVar1;
  undefined7 in_register_00000089;
  float f;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 uVar2;
  ai_real aVar3;
  aiVector3t<float> aVar4;
  aiColor3D aVar5;
  byte in_stack_00000008;
  float fStack_58;
  float factor;
  float local_50;
  undefined1 local_48 [8];
  aiVector3D BaseColor;
  bool ok;
  bool useTemplate_local;
  bool *result_local;
  string *factorName_local;
  string *colorName_local;
  PropertyTable *props_local;
  FBXConverter *this_local;
  
  unique0x1000003f = (undefined1 *)CONCAT71(in_register_00000089,useTemplate);
  BaseColor.y._3_1_ = in_stack_00000008 & 1;
  *unique0x1000003f = 1;
  aVar4 = PropertyGet<aiVector3t<float>>
                    ((PropertyTable *)colorName,factorName,(bool *)((long)&BaseColor.y + 2),
                     (bool)BaseColor.y._3_1_);
  _fStack_58 = aVar4._0_8_;
  local_48._0_4_ = fStack_58;
  local_48._4_4_ = factor;
  local_50 = aVar4.z;
  BaseColor.x = local_50;
  if ((BaseColor.y._2_1_ & 1) == 0) {
    *stack0xffffffffffffffc8 = 0;
    aVar3 = 0.0;
    aiColor3D::aiColor3D((aiColor3D *)this,0.0,0.0,0.0);
    uVar2 = extraout_XMM0_Qa;
    local_48._4_4_ = aVar3;
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      f = PropertyGet<float>((PropertyTable *)colorName,(string *)result,
                             (bool *)((long)&BaseColor.y + 2),(bool)(BaseColor.y._3_1_ & 1));
      if ((BaseColor.y._2_1_ & 1) != 0) {
        aiVector3t<float>::operator*=((aiVector3t<float> *)local_48,f);
      }
      aiColor3D::aiColor3D
                ((aiColor3D *)this,(ai_real)local_48._0_4_,(ai_real)local_48._4_4_,BaseColor.x);
      uVar2 = extraout_XMM0_Qa_01;
    }
    else {
      aiColor3D::aiColor3D
                ((aiColor3D *)this,(ai_real)local_48._0_4_,(ai_real)local_48._4_4_,BaseColor.x);
      uVar2 = extraout_XMM0_Qa_00;
    }
  }
  aVar5.b = (ai_real)local_48._4_4_;
  aVar5.r = (ai_real)(int)uVar2;
  aVar5.g = (ai_real)(int)((ulong)uVar2 >> 0x20);
  return aVar5;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFactored(const PropertyTable& props, const std::string& colorName,
            const std::string& factorName, bool& result, bool useTemplate)
        {
            result = true;

            bool ok;
            aiVector3D BaseColor = PropertyGet<aiVector3D>(props, colorName, ok, useTemplate);
            if (!ok) {
                result = false;
                return aiColor3D(0.0f, 0.0f, 0.0f);
            }

            // if no factor name, return the colour as is
            if (factorName.empty()) {
                return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
            }

            // otherwise it should be multiplied by the factor, if found.
            float factor = PropertyGet<float>(props, factorName, ok, useTemplate);
            if (ok) {
                BaseColor *= factor;
            }
            return aiColor3D(BaseColor.x, BaseColor.y, BaseColor.z);
        }